

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_random(Curl_easy *data,uchar *entropy,size_t length)

{
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  int rc;
  size_t length_local;
  uchar *entropy_local;
  Curl_easy *data_local;
  
  if (data == (Curl_easy *)0x0) {
    _Var1 = rand_enough();
    if (!_Var1) {
      return CURLE_FAILED_INIT;
    }
  }
  else {
    CVar2 = Curl_ossl_seed(data);
    if (CVar2 != CURLE_OK) {
      return CURLE_FAILED_INIT;
    }
  }
  iVar3 = curlx_uztosi(length);
  iVar3 = RAND_bytes(entropy,iVar3);
  data_local._4_4_ = CURLE_FAILED_INIT;
  if (iVar3 == 1) {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode Curl_ossl_random(struct Curl_easy *data,
                                 unsigned char *entropy, size_t length)
{
  int rc;
  if(data) {
    if(Curl_ossl_seed(data)) /* Initiate the seed if not already done */
      return CURLE_FAILED_INIT; /* couldn't seed for some reason */
  }
  else {
    if(!rand_enough())
      return CURLE_FAILED_INIT;
  }
  /* RAND_bytes() returns 1 on success, 0 otherwise.  */
  rc = RAND_bytes(entropy, curlx_uztosi(length));
  return (rc == 1 ? CURLE_OK : CURLE_FAILED_INIT);
}